

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_traffic_class.hpp
# Opt level: O3

void libtorrent::aux::
     set_traffic_class<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
               (basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *s,int v,error_code *ec)

{
  implementation_type *impl;
  data_union local_44;
  
  impl = &(s->impl_).implementation_;
  boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::local_endpoint
            ((endpoint_type *)&local_44.base,(s->impl_).service_,impl,ec);
  if (local_44.base.sa_family == 2) {
    if (ec->failed_ == false) {
      local_44._0_4_ = v & 0xfc;
      boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
      set_option<libtorrent::type_of_service>
                ((s->impl_).service_,impl,(bind_to_device *)&local_44.base,ec);
    }
  }
  else {
    local_44._0_4_ = v & 0xfc;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    set_option<libtorrent::traffic_class>
              ((s->impl_).service_,impl,(bind_to_device *)&local_44.base,ec);
  }
  return;
}

Assistant:

void set_traffic_class(Socket& s, int v, error_code& ec)
	{
#ifdef IP_DSCP_TRAFFIC_TYPE
		s.set_option(dscp_traffic_type((v & 0xff) >> 2), ec);
		if (!ec) return;
		ec.clear();
#endif
#if defined IPV6_TCLASS
		if (is_v6(s.local_endpoint(ec)))
			s.set_option(traffic_class(v & 0xfc), ec);
		else if (!ec)
#endif
			s.set_option(type_of_service(v & 0xfc), ec);
	}